

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkedAllocator.c
# Opt level: O0

void sysbvm_chunkedAllocator_destroy(sysbvm_chunkedAllocator_t *allocator)

{
  sysbvm_chunkedAllocatorChunk_s **ppsVar1;
  sysbvm_chunkedAllocatorChunk_s *psVar2;
  size_t sizeToFree;
  sysbvm_chunkedAllocatorChunk_t *writeableMapping_1;
  sysbvm_chunkedAllocatorChunk_t *executableMapping;
  sysbvm_chunkedAllocatorChunk_t *writeableMapping;
  size_t fullChunkSize;
  sysbvm_chunkedAllocatorChunk_t *nextChunk;
  sysbvm_chunkedAllocatorChunk_t *chunk;
  sysbvm_chunkedAllocator_t *allocator_local;
  
  nextChunk = allocator->firstChunk;
  while (nextChunk != (sysbvm_chunkedAllocatorChunk_t *)0x0) {
    psVar2 = nextChunk->next;
    sizeToFree = nextChunk->capacity + 0x40;
    if (((allocator->requiresExecutableMapping & 1U) == 0) ||
       (nextChunk->writeableMapping == nextChunk->executableMapping)) {
      ppsVar1 = &nextChunk->writeableMapping;
      nextChunk = psVar2;
      if (*ppsVar1 != (sysbvm_chunkedAllocatorChunk_s *)0x0) {
        sysbvm_virtualMemory_freeSystemMemory(*ppsVar1,sizeToFree);
      }
    }
    else {
      sysbvm_virtualMemory_freeSystemMemoryWithDualMapping
                (sizeToFree,nextChunk->dualMappingHandle,nextChunk->writeableMapping,
                 nextChunk->executableMapping);
      nextChunk = psVar2;
    }
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_chunkedAllocator_destroy(sysbvm_chunkedAllocator_t *allocator)
{
    sysbvm_chunkedAllocatorChunk_t *chunk = allocator->firstChunk;
    while(chunk)
    {
        sysbvm_chunkedAllocatorChunk_t *nextChunk = chunk->next;
        size_t fullChunkSize = sizeof(sysbvm_chunkedAllocatorChunk_t) + chunk->capacity;

        if(allocator->requiresExecutableMapping && chunk->writeableMapping != chunk->executableMapping)
        {
            sysbvm_chunkedAllocatorChunk_t *writeableMapping = chunk->writeableMapping;
            sysbvm_chunkedAllocatorChunk_t *executableMapping = chunk->executableMapping;
            sysbvm_virtualMemory_freeSystemMemoryWithDualMapping(fullChunkSize, chunk->dualMappingHandle, writeableMapping, executableMapping);
            chunk = nextChunk;

        }
        else
        {
            sysbvm_chunkedAllocatorChunk_t *writeableMapping = chunk->writeableMapping;
            if(writeableMapping)
                sysbvm_virtualMemory_freeSystemMemory(writeableMapping, fullChunkSize);
        }

        chunk = nextChunk;
    }
}